

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_end(AMQP_VALUE value,END_HANDLE *end_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  ERROR_HANDLE local_48;
  ERROR_HANDLE error;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  END_INSTANCE *end_instance;
  END_HANDLE *ppEStack_18;
  int result;
  END_HANDLE *end_handle_local;
  AMQP_VALUE value_local;
  
  ppEStack_18 = end_handle;
  end_handle_local = (END_HANDLE *)value;
  list_value = (AMQP_VALUE)end_create_internal();
  *ppEStack_18 = (END_HANDLE)list_value;
  if (*ppEStack_18 == (END_HANDLE)0x0) {
    end_instance._4_4_ = 0x25ea;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)end_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      end_destroy(*ppEStack_18);
      end_instance._4_4_ = 0x25f2;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (error = (ERROR_HANDLE)amqpvalue_get_list_item(pAStack_30,0),
           (AMQP_VALUE)error != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)error);
          if (AVar2 != AMQP_TYPE_NULL) {
            iVar1 = amqpvalue_get_error((AMQP_VALUE)error,&local_48);
            if (iVar1 != 0) {
              amqpvalue_destroy((AMQP_VALUE)error);
              end_destroy(*ppEStack_18);
              return 0x2615;
            }
            error_destroy(local_48);
          }
          amqpvalue_destroy((AMQP_VALUE)error);
        }
        pAVar3 = amqpvalue_clone((AMQP_VALUE)end_handle_local);
        *(AMQP_VALUE *)list_value = pAVar3;
        end_instance._4_4_ = 0;
      }
      else {
        end_instance._4_4_ = 0x25f9;
      }
    }
  }
  return end_instance._4_4_;
}

Assistant:

int amqpvalue_get_end(AMQP_VALUE value, END_HANDLE* end_handle)
{
    int result;
    END_INSTANCE* end_instance = (END_INSTANCE*)end_create_internal();
    *end_handle = end_instance;
    if (*end_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            end_destroy(*end_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* error */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                ERROR_HANDLE error;
                                if (amqpvalue_get_error(item_value, &error) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    end_destroy(*end_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                                else
                                {
                                    error_destroy(error);
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    end_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}